

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::Logger::log_<char[12],char*>
          (Logger *this,Level level,int vlevel,char *s,char (*value) [12],char **args)

{
  char msg;
  MessageBuilder b;
  MessageBuilder local_40;
  
  local_40.m_logger = (Logger *)0x0;
  local_40.m_containerLogSeperator = "";
  base::MessageBuilder::initialize(&local_40,this);
  do {
    if (*s == '%') {
      if (s[1] == '%') {
        s = s + 1;
      }
      else if (s[1] == 'v') {
        base::MessageBuilder::operator<<(&local_40,*value);
        log_<char*>(this,level,vlevel,s + 2,args);
        return;
      }
    }
    else if (*s == '\0') {
      return;
    }
    msg = *s;
    s = s + 1;
    base::MessageBuilder::operator<<(&local_40,msg);
  } while( true );
}

Assistant:

void Logger::log_(Level level, int vlevel, const char* s, const T& value, const Args&... args) {
  base::MessageBuilder b;
  b.initialize(this);
  while (*s) {
    if (*s == base::consts::kFormatSpecifierChar) {
      if (*(s + 1) == base::consts::kFormatSpecifierChar) {
        ++s;
      } else {
        if (*(s + 1) == base::consts::kFormatSpecifierCharValue) {
          ++s;
          b << value;
          log_(level, vlevel, ++s, args...);
          return;
        }
      }
    }
    b << *s++;
  }
  ELPP_INTERNAL_ERROR("Too many arguments provided. Unable to handle. Please provide more format specifiers", false);
}